

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int ecp_normalize_jac_many(mbedtls_ecp_group *grp,mbedtls_ecp_point **T,size_t t_len)

{
  int iVar1;
  mbedtls_mpi *X;
  mbedtls_mpi *pmVar2;
  long lVar3;
  mbedtls_mpi *X_00;
  size_t sVar4;
  mbedtls_mpi Zi;
  mbedtls_mpi u;
  mbedtls_mpi ZZi;
  mbedtls_mpi local_78;
  mbedtls_mpi local_60;
  mbedtls_mpi local_48;
  
  if (t_len < 2) {
    iVar1 = ecp_normalize_jac(grp,*T);
    return iVar1;
  }
  X = (mbedtls_mpi *)calloc(t_len,0x18);
  if (X == (mbedtls_mpi *)0x0) {
    iVar1 = -0x4d80;
  }
  else {
    mbedtls_mpi_init(&local_60);
    mbedtls_mpi_init(&local_78);
    mbedtls_mpi_init(&local_48);
    iVar1 = mbedtls_mpi_copy(X,&(*T)->Z);
    if (iVar1 == 0) {
      sVar4 = 1;
      pmVar2 = X;
      do {
        X_00 = pmVar2 + 1;
        iVar1 = mbedtls_mpi_mul_mpi(X_00,pmVar2,&T[sVar4]->Z);
        if ((iVar1 != 0) || (iVar1 = ecp_modp(X_00,grp), iVar1 != 0)) goto LAB_0011037f;
        mul_count = mul_count + 1;
        sVar4 = sVar4 + 1;
        pmVar2 = X_00;
      } while (t_len != sVar4);
      iVar1 = mbedtls_mpi_inv_mod(&local_60,X + (t_len - 1),&grp->P);
      if (iVar1 == 0) {
        pmVar2 = X + (t_len - 2);
        sVar4 = t_len;
        do {
          if (sVar4 == 1) {
            iVar1 = mbedtls_mpi_copy(&local_78,&local_60);
            if (iVar1 != 0) break;
          }
          else {
            iVar1 = mbedtls_mpi_mul_mpi(&local_78,&local_60,pmVar2);
            if ((iVar1 != 0) || (iVar1 = ecp_modp(&local_78,grp), iVar1 != 0)) break;
            mul_count = mul_count + 1;
            iVar1 = mbedtls_mpi_mul_mpi(&local_60,&local_60,&T[sVar4 - 1]->Z);
            if ((iVar1 != 0) || (iVar1 = ecp_modp(&local_60,grp), iVar1 != 0)) break;
            mul_count = mul_count + 1;
          }
          iVar1 = mbedtls_mpi_mul_mpi(&local_48,&local_78,&local_78);
          if (iVar1 != 0) break;
          iVar1 = ecp_modp(&local_48,grp);
          if (iVar1 != 0) break;
          mul_count = mul_count + 1;
          iVar1 = mbedtls_mpi_mul_mpi(&T[sVar4 - 1]->X,&T[sVar4 - 1]->X,&local_48);
          if ((iVar1 != 0) || (iVar1 = ecp_modp(&T[sVar4 - 1]->X,grp), iVar1 != 0)) break;
          mul_count = mul_count + 1;
          iVar1 = mbedtls_mpi_mul_mpi(&T[sVar4 - 1]->Y,&T[sVar4 - 1]->Y,&local_48);
          if ((iVar1 != 0) || (iVar1 = ecp_modp(&T[sVar4 - 1]->Y,grp), iVar1 != 0)) break;
          mul_count = mul_count + 1;
          iVar1 = mbedtls_mpi_mul_mpi(&T[sVar4 - 1]->Y,&T[sVar4 - 1]->Y,&local_78);
          if ((iVar1 != 0) || (iVar1 = ecp_modp(&T[sVar4 - 1]->Y,grp), iVar1 != 0)) break;
          mul_count = mul_count + 1;
          iVar1 = mbedtls_mpi_shrink(&T[sVar4 - 1]->X,(grp->P).n);
          if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_shrink(&T[sVar4 - 1]->Y,(grp->P).n), iVar1 != 0))
          break;
          mbedtls_mpi_free(&T[sVar4 - 1]->Z);
          pmVar2 = pmVar2 + -1;
          iVar1 = 0;
          sVar4 = sVar4 - 1;
          if (sVar4 == 0) break;
        } while( true );
      }
    }
LAB_0011037f:
    mbedtls_mpi_free(&local_60);
    mbedtls_mpi_free(&local_78);
    mbedtls_mpi_free(&local_48);
    lVar3 = t_len + (t_len == 0);
    pmVar2 = X;
    do {
      mbedtls_mpi_free(pmVar2);
      pmVar2 = pmVar2 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    free(X);
  }
  return iVar1;
}

Assistant:

static int ecp_normalize_jac_many( const mbedtls_ecp_group *grp,
                                   mbedtls_ecp_point *T[], size_t t_len )
{
    int ret;
    size_t i;
    mbedtls_mpi *c, u, Zi, ZZi;

    if( t_len < 2 )
        return( ecp_normalize_jac( grp, *T ) );

#if defined(MBEDTLS_ECP_NORMALIZE_JAC_MANY_ALT)
    if ( mbedtls_internal_ecp_grp_capable( grp ) )
    {
        return mbedtls_internal_ecp_normalize_jac_many(grp, T, t_len);
    }
#endif

    if( ( c = mbedtls_calloc( t_len, sizeof( mbedtls_mpi ) ) ) == NULL )
        return( MBEDTLS_ERR_ECP_ALLOC_FAILED );

    mbedtls_mpi_init( &u ); mbedtls_mpi_init( &Zi ); mbedtls_mpi_init( &ZZi );

    /*
     * c[i] = Z_0 * ... * Z_i
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &c[0], &T[0]->Z ) );
    for( i = 1; i < t_len; i++ )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &c[i], &c[i-1], &T[i]->Z ) );
        MOD_MUL( c[i] );
    }

    /*
     * u = 1 / (Z_0 * ... * Z_n) mod P
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &u, &c[t_len-1], &grp->P ) );

    for( i = t_len - 1; ; i-- )
    {
        /*
         * Zi = 1 / Z_i mod p
         * u = 1 / (Z_0 * ... * Z_i) mod P
         */
        if( i == 0 ) {
            MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &Zi, &u ) );
        }
        else
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &Zi, &u, &c[i-1]  ) ); MOD_MUL( Zi );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &u,  &u, &T[i]->Z ) ); MOD_MUL( u );
        }

        /*
         * proceed as in normalize()
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &ZZi,     &Zi,      &Zi  ) ); MOD_MUL( ZZi );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T[i]->X, &T[i]->X, &ZZi ) ); MOD_MUL( T[i]->X );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T[i]->Y, &T[i]->Y, &ZZi ) ); MOD_MUL( T[i]->Y );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T[i]->Y, &T[i]->Y, &Zi  ) ); MOD_MUL( T[i]->Y );

        /*
         * Post-precessing: reclaim some memory by shrinking coordinates
         * - not storing Z (always 1)
         * - shrinking other coordinates, but still keeping the same number of
         *   limbs as P, as otherwise it will too likely be regrown too fast.
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_shrink( &T[i]->X, grp->P.n ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shrink( &T[i]->Y, grp->P.n ) );
        mbedtls_mpi_free( &T[i]->Z );

        if( i == 0 )
            break;
    }

cleanup:

    mbedtls_mpi_free( &u ); mbedtls_mpi_free( &Zi ); mbedtls_mpi_free( &ZZi );
    for( i = 0; i < t_len; i++ )
        mbedtls_mpi_free( &c[i] );
    mbedtls_free( c );

    return( ret );
}